

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

uchar * Gia_AigerWriteMappingInt(Gia_Man_t *p,int *pMapSize)

{
  int iVar1;
  uint x;
  uchar *pPos;
  int *piVar2;
  int local_38;
  int local_34;
  int iPos;
  int nItems;
  int iFan;
  int iPrev;
  int k;
  int i;
  uchar *pBuffer;
  int *pMapSize_local;
  Gia_Man_t *p_local;
  
  local_38 = 4;
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    local_34 = 0;
    for (iPrev = 1; iVar1 = Gia_ManObjNum(p), iPrev < iVar1; iPrev = iPrev + 1) {
      iVar1 = Gia_ObjIsLut(p,iPrev);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjLutSize(p,iPrev);
        local_34 = iVar1 + 2 + local_34;
      }
    }
    pPos = (uchar *)malloc((long)(local_34 + 1) << 2);
    nItems = 0;
    for (iPrev = 1; iVar1 = Gia_ManObjNum(p), iPrev < iVar1; iPrev = iPrev + 1) {
      iVar1 = Gia_ObjIsLut(p,iPrev);
      if (iVar1 != 0) {
        x = Gia_ObjLutSize(p,iPrev);
        local_38 = Gia_AigerWriteUnsignedBuffer(pPos,local_38,x);
        for (iFan = 0; iVar1 = Gia_ObjLutSize(p,iPrev), iFan < iVar1; iFan = iFan + 1) {
          piVar2 = Gia_ObjLutFanins(p,iPrev);
          iVar1 = piVar2[iFan];
          local_38 = Gia_AigerWriteDiffValue(pPos,local_38,nItems,iVar1);
          nItems = iVar1;
        }
        local_38 = Gia_AigerWriteDiffValue(pPos,local_38,nItems,iPrev);
        nItems = iPrev;
      }
    }
    Gia_AigerWriteInt(pPos,local_38);
    *pMapSize = local_38;
    return pPos;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                ,0xae,"unsigned char *Gia_AigerWriteMappingInt(Gia_Man_t *, int *)");
}

Assistant:

unsigned char * Gia_AigerWriteMappingInt( Gia_Man_t * p, int * pMapSize )
{
    unsigned char * pBuffer;
    int i, k, iPrev, iFan, nItems, iPos = 4;
    assert( Gia_ManHasMapping(p) );
    // count the number of entries to be written
    nItems = 0;
    Gia_ManForEachLut( p, i )
        nItems += 2 + Gia_ObjLutSize( p, i );
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 1) );
    // write non-constant classes
    iPrev = 0;
    Gia_ManForEachLut( p, i )
    {
//printf( "\nSize = %d ", Gia_ObjLutSize(p, i) );
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
        {
//printf( "Fan = %d ", iFan );
            iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, iFan );
            iPrev = iFan;
        }
        iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, i );
        iPrev = i;
//printf( "Node = %d ", i );
    }
//printf( "\n" );
    Gia_AigerWriteInt( pBuffer, iPos );
    *pMapSize = iPos;
    return pBuffer;
}